

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationProcessing.hpp
# Opt level: O2

char processOperation(char b,char a,string *op)

{
  bool bVar1;
  byte bVar2;
  double dVar3;
  
  bVar1 = std::operator==(op,"+");
  if (bVar1) {
    bVar2 = a + b;
  }
  else {
    bVar1 = std::operator==(op,"-");
    if (bVar1) {
      bVar2 = a - b;
    }
    else {
      bVar1 = std::operator==(op,"*");
      if (bVar1) {
        bVar2 = a * b;
      }
      else {
        bVar1 = std::operator==(op,"/");
        if (bVar1) {
          bVar2 = a / b;
        }
        else {
          bVar1 = std::operator==(op,"**");
          if (bVar1) {
            dVar3 = pow((double)(int)a,(double)(int)b);
            bVar2 = (byte)(int)dVar3;
          }
          else {
            bVar1 = std::operator==(op,"%");
            if (bVar1) {
              bVar2 = a % b;
            }
            else {
              bVar1 = std::operator==(op,"&");
              if (bVar1) {
                bVar2 = a & b;
              }
              else {
                bVar1 = std::operator==(op,"|");
                if (bVar1) {
                  bVar2 = a | b;
                }
                else {
                  bVar1 = std::operator==(op,"^");
                  if (bVar1) {
                    bVar2 = a ^ b;
                  }
                  else {
                    bVar1 = std::operator==(op,">>");
                    if (bVar1) {
                      bVar2 = (byte)((int)b >> (a & 0x1fU));
                    }
                    else {
                      std::operator==(op,"<<");
                      bVar2 = b << (a & 0x1fU);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

char processOperation(char b, char a, string op) {
	if (op == "+") {
		return a + b;
	}
	if (op == "-") {
		return a - b;
	}
	if (op == "*") {
		return a * b;
	}
	if (op == "/") {
		return a / b;
	}
	if (op == "**") {
		return pow(a, b);
	}
	if (op == "%") {
		return a % b;
	}
	if (op == "&") {
		return b & a;
	}
	if (op == "|") {
		return b | a;
	}
	if (op == "^") {
		return b ^ a;
	}
	if (op == ">>") {
		return b >> a;
	}
	if (op == "<<") {
		return b << a;
	}
}